

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>::
rehash(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
       *this,size_t sizeHint)

{
  Entry *pEVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *pNVar6;
  ulong uVar7;
  ulong uVar8;
  size_t index;
  long lVar9;
  Span *pSVar10;
  size_t numBuckets;
  long lVar11;
  R RVar12;
  Bucket BVar13;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar12 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar12.spans;
  this->numBuckets = numBuckets;
  if (uVar3 < 0x80) {
    if (pSVar4 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar7 = 0;
    pSVar10 = pSVar4;
    do {
      lVar9 = 0;
      do {
        bVar2 = pSVar10->offsets[lVar9];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar7].entries;
          pEVar1 = pEVar5 + bVar2;
          uVar8 = *(ulong *)(pEVar1->storage).data;
          uVar8 = (uVar8 >> 0x20 ^ uVar8) * -0x2917014799a6026d;
          uVar8 = (uVar8 >> 0x20 ^ uVar8) * -0x2917014799a6026d;
          BVar13 = Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                   ::findBucketWithHash<QHttp2Stream*>
                             ((Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                               *)this,(QHttp2Stream **)(pEVar5 + bVar2),
                              uVar8 >> 0x20 ^ this->seed ^ uVar8);
          pNVar6 = Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
                   ::insert(BVar13.span,BVar13.index);
          pNVar6->key = *(QHttp2Stream **)(pEVar1->storage).data;
          QHttpNetworkRequest::QHttpNetworkRequest
                    (&(pNVar6->value).first,(QHttpNetworkRequest *)((pEVar1->storage).data + 8));
          (pNVar6->value).second = *(QHttpNetworkReply **)((pEVar1->storage).data + 0x18);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
      ::freeData(pSVar4 + uVar7);
      uVar7 = uVar7 + 1;
      pSVar10 = pSVar10 + 1;
    } while (uVar7 != uVar3 >> 7);
  }
  lVar9 = *(long *)&pSVar4[-1].allocated;
  if (lVar9 != 0) {
    lVar11 = lVar9 * 0x90;
    do {
      Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
      ::freeData((Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
                  *)(pSVar4[-1].offsets + lVar11));
      lVar11 = lVar11 + -0x90;
    } while (lVar11 != 0);
  }
  operator_delete__(&pSVar4[-1].allocated,lVar9 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }